

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall
NetOptimize::replace_convolution_with_innerproduct_after_innerproduct(NetOptimize *this)

{
  int iVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  bool bVar6;
  int iVar7;
  size_type sVar8;
  reference ppLVar9;
  reference pvVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long in_RDI;
  Mat *this_00;
  ParamDict pd;
  InnerProduct *innerproduct2;
  Convolution *convolution;
  InnerProduct *innerproduct;
  int j;
  int top_blob_index;
  int i;
  bool replaced;
  int layer_count;
  Layer *in_stack_fffffffffffff678;
  value_type in_stack_fffffffffffff680;
  value_type pLVar13;
  FILE *__stream;
  ParamDict *in_stack_fffffffffffff6c0;
  undefined1 local_938 [80];
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff718;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff720;
  int local_1c;
  int local_14;
  
  sVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40));
  iVar7 = (int)sVar8;
  do {
    bVar2 = false;
    for (local_14 = 0; local_14 < iVar7; local_14 = local_14 + 1) {
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                 (long)local_14);
      bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff680,(char *)in_stack_fffffffffffff678);
      if (!bVar6) {
        ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_14);
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar9)->tops,0);
        iVar1 = *pvVar10;
        local_1c = local_14;
        do {
          do {
            do {
              local_1c = local_1c + 1;
              if (iVar7 <= local_1c) goto LAB_0011a071;
              std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                         (long)local_1c);
              bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffff680,(char *)in_stack_fffffffffffff678
                                     );
            } while (bVar6);
            ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                 (in_RDI + 0x40),(long)local_1c);
            sVar8 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar9)->bottoms);
          } while (sVar8 != 1);
          ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_1c);
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar9)->bottoms,0);
        } while (*pvVar10 != iVar1);
LAB_0011a071:
        if (local_1c != iVar7) {
          this_00 = (Mat *)(in_RDI + 0x40);
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)this_00,(long)local_14
                    );
          ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)this_00,
                               (long)local_1c);
          pLVar13 = *ppLVar9;
          __stream = _stderr;
          uVar11 = std::__cxx11::string::c_str();
          uVar12 = std::__cxx11::string::c_str();
          fprintf(__stream,"replace_convolution_with_innerproduct_after_innerproduct %s %s\n",uVar11
                  ,uVar12);
          in_stack_fffffffffffff678 = ncnn::create_layer((char *)in_stack_fffffffffffff678);
          std::__cxx11::string::operator=((string *)&in_stack_fffffffffffff678->type,"InnerProduct")
          ;
          std::__cxx11::string::operator=
                    ((string *)&in_stack_fffffffffffff678->name,(string *)&pLVar13->name);
          std::vector<int,_std::allocator<int>_>::operator=
                    (in_stack_fffffffffffff720,in_stack_fffffffffffff718);
          std::vector<int,_std::allocator<int>_>::operator=
                    (in_stack_fffffffffffff720,in_stack_fffffffffffff718);
          ncnn::ParamDict::ParamDict(in_stack_fffffffffffff6c0);
          (*in_stack_fffffffffffff678->_vptr_Layer[2])(in_stack_fffffffffffff678,local_938);
          *(undefined4 *)&in_stack_fffffffffffff678[1]._vptr_Layer =
               *(undefined4 *)&pLVar13[1]._vptr_Layer;
          *(undefined4 *)((long)&in_stack_fffffffffffff678[1]._vptr_Layer + 4) =
               *(undefined4 *)&pLVar13[1].name;
          uVar3 = pLVar13[1].name.field_0x5;
          uVar4 = pLVar13[1].name.field_0x6;
          uVar5 = pLVar13[1].name.field_0x7;
          in_stack_fffffffffffff678[1].one_blob_only = (bool)pLVar13[1].name.field_0x4;
          in_stack_fffffffffffff678[1].support_inplace = (bool)uVar3;
          in_stack_fffffffffffff678[1].support_vulkan = (bool)uVar4;
          in_stack_fffffffffffff678[1].support_packing = (bool)uVar5;
          ncnn::Mat::operator=(this_00,(Mat *)in_stack_fffffffffffff680);
          ncnn::Mat::operator=(this_00,(Mat *)in_stack_fffffffffffff680);
          *(undefined4 *)&in_stack_fffffffffffff678[1].type =
               *(undefined4 *)((long)&pLVar13[1].name._M_string_length + 4);
          ncnn::Mat::operator=(this_00,(Mat *)in_stack_fffffffffffff680);
          ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_1c);
          *ppLVar9 = in_stack_fffffffffffff678;
          in_stack_fffffffffffff680 = pLVar13;
          if (pLVar13 != (value_type)0x0) {
            (*pLVar13->_vptr_Layer[1])();
            in_stack_fffffffffffff680 = pLVar13;
          }
          bVar2 = true;
          ncnn::ParamDict::~ParamDict((ParamDict *)__stream);
        }
      }
    }
    if (!bVar2) {
      return 0;
    }
  } while( true );
}

Assistant:

int NetOptimize::replace_convolution_with_innerproduct_after_innerproduct()
{
    const int layer_count = layers.size();
    for (;;)
    {
    bool replaced = false;

    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "InnerProduct")
            continue;

        // InnerProduct - Convolution
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "Convolution")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layers[i];
        ncnn::Convolution* convolution = (ncnn::Convolution*)layers[j];

        fprintf(stderr, "replace_convolution_with_innerproduct_after_innerproduct %s %s\n", innerproduct->name.c_str(), convolution->name.c_str());

        ncnn::InnerProduct* innerproduct2 = (ncnn::InnerProduct*)ncnn::create_layer("InnerProduct");

        innerproduct2->type = "InnerProduct";
        innerproduct2->name = convolution->name;
        innerproduct2->bottoms = convolution->bottoms;
        innerproduct2->tops = convolution->tops;

        ncnn::ParamDict pd;
        innerproduct2->load_param(pd);

        innerproduct2->num_output = convolution->num_output;
        innerproduct2->bias_term = convolution->bias_term;
        innerproduct2->weight_data_size = convolution->weight_data_size;

        innerproduct2->weight_data = convolution->weight_data;
        innerproduct2->bias_data = convolution->bias_data;

        innerproduct2->activation_type = convolution->activation_type;
        innerproduct2->activation_params = convolution->activation_params;

        layers[j] = innerproduct2;
        delete convolution;

        replaced = true;
    }

    if (!replaced)
        break;
    }

    return 0;
}